

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O2

ring_buffer_size_t
PaUtil_InitializeRingBuffer
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementSizeBytes,
          ring_buffer_size_t elementCount,void *dataPtr)

{
  if ((elementCount & elementCount - 1U) == 0) {
    rbuf->bufferSize = elementCount;
    rbuf->buffer = (char *)dataPtr;
    rbuf->readIndex = 0;
    rbuf->writeIndex = 0;
    rbuf->bigMask = elementCount * 2 + -1;
    rbuf->smallMask = elementCount - 1U;
    rbuf->elementSizeBytes = elementSizeBytes;
    return 0;
  }
  return -1;
}

Assistant:

ring_buffer_size_t PaUtil_InitializeRingBuffer( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementSizeBytes, ring_buffer_size_t elementCount, void *dataPtr )
{
    if( ((elementCount-1) & elementCount) != 0) return -1; /* Not Power of two. */
    rbuf->bufferSize = elementCount;
    rbuf->buffer = (char *)dataPtr;
    PaUtil_FlushRingBuffer( rbuf );
    rbuf->bigMask = (elementCount*2)-1;
    rbuf->smallMask = (elementCount)-1;
    rbuf->elementSizeBytes = elementSizeBytes;
    return 0;
}